

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWGenerator.cxx
# Opt level: O2

cmCPackComponentGroup * __thiscall
cmCPackIFWGenerator::GetComponentGroup
          (cmCPackIFWGenerator *this,string *projectName,string *groupName)

{
  PackagesMap *this_00;
  cmCPackLog *this_01;
  int iVar1;
  cmCPackComponentGroup *group;
  iterator iVar2;
  mapped_type *this_02;
  ostream *poVar3;
  cmCPackIFWPackage *package;
  string name;
  char *local_1b8 [4];
  ostringstream cmCPackLog_msg;
  
  group = cmCPackGenerator::GetComponentGroup(&this->super_cmCPackGenerator,projectName,groupName);
  if (group != (cmCPackComponentGroup *)0x0) {
    GetGroupPackageName_abi_cxx11_(&name,this,group);
    this_00 = &this->Packages;
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
            ::find(&this_00->_M_t,&name);
    if ((_Rb_tree_header *)iVar2._M_node == &(this->Packages)._M_t._M_impl.super__Rb_tree_header) {
      this_02 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
                ::operator[](this_00,&name);
      package = this_02;
      std::__cxx11::string::_M_assign((string *)&this_02->Name);
      this_02->Generator = this;
      iVar1 = cmCPackIFWPackage::ConfigureFromGroup(this_02,group);
      if (iVar1 == 0) {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage>_>_>
        ::erase(&this_00->_M_t,&name);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg);
        poVar3 = std::operator<<((ostream *)&cmCPackLog_msg,"Cannot configure package \"");
        poVar3 = std::operator<<(poVar3,(string *)&name);
        poVar3 = std::operator<<(poVar3,"\" for component group \"");
        poVar3 = std::operator<<(poVar3,(string *)group);
        poVar3 = std::operator<<(poVar3,"\"");
        std::endl<char,std::char_traits<char>>(poVar3);
        this_01 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        cmCPackLog::Log(this_01,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/IFW/cmCPackIFWGenerator.cxx"
                        ,0x1d5,local_1b8[0]);
        std::__cxx11::string::~string((string *)local_1b8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg);
      }
      else {
        this_02->Installer = &this->Installer;
        std::__cxx11::string::string((string *)&cmCPackLog_msg,(string *)&name);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCPackIFWPackage*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCPackIFWPackage*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCPackIFWPackage*>>>
        ::_M_emplace_unique<std::pair<std::__cxx11::string,cmCPackIFWPackage*>>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmCPackIFWPackage*>,std::_Select1st<std::pair<std::__cxx11::string_const,cmCPackIFWPackage*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmCPackIFWPackage*>>>
                    *)&(this->Installer).Packages,
                   (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackIFWPackage_*>
                    *)&cmCPackLog_msg);
        std::__cxx11::string::~string((string *)&cmCPackLog_msg);
        _cmCPackLog_msg = (pointer)group;
        std::
        _Rb_tree<cmCPackComponentGroup*,std::pair<cmCPackComponentGroup*const,cmCPackIFWPackage*>,std::_Select1st<std::pair<cmCPackComponentGroup*const,cmCPackIFWPackage*>>,std::less<cmCPackComponentGroup*>,std::allocator<std::pair<cmCPackComponentGroup*const,cmCPackIFWPackage*>>>
        ::_M_emplace_unique<std::pair<cmCPackComponentGroup*,cmCPackIFWPackage*>>
                  ((_Rb_tree<cmCPackComponentGroup*,std::pair<cmCPackComponentGroup*const,cmCPackIFWPackage*>,std::_Select1st<std::pair<cmCPackComponentGroup*const,cmCPackIFWPackage*>>,std::less<cmCPackComponentGroup*>,std::allocator<std::pair<cmCPackComponentGroup*const,cmCPackIFWPackage*>>>
                    *)&this->GroupPackages,
                   (pair<cmCPackComponentGroup_*,_cmCPackIFWPackage_*> *)&cmCPackLog_msg);
        std::
        _Rb_tree<cmCPackIFWPackage*,cmCPackIFWPackage*,std::_Identity<cmCPackIFWPackage*>,std::less<cmCPackIFWPackage*>,std::allocator<cmCPackIFWPackage*>>
        ::_M_insert_unique<cmCPackIFWPackage*const&>
                  ((_Rb_tree<cmCPackIFWPackage*,cmCPackIFWPackage*,std::_Identity<cmCPackIFWPackage*>,std::less<cmCPackIFWPackage*>,std::allocator<cmCPackIFWPackage*>>
                    *)&this->BinaryPackages,&package);
      }
    }
    std::__cxx11::string::~string((string *)&name);
  }
  return group;
}

Assistant:

cmCPackComponentGroup*
cmCPackIFWGenerator::GetComponentGroup(const std::string &projectName,
                                       const std::string &groupName)
{
  cmCPackComponentGroup* group
    = cmCPackGenerator::GetComponentGroup(projectName, groupName);
  if(!group) return group;

  std::string name = GetGroupPackageName(group);
  PackagesMap::iterator pit = Packages.find(name);
  if(pit != Packages.end()) return group;

  cmCPackIFWPackage *package = &Packages[name];
  package->Name = name;
  package->Generator = this;
  if(package->ConfigureFromGroup(group))
    {
    package->Installer = &Installer;
    Installer.Packages.insert(
      std::pair<std::string, cmCPackIFWPackage*>(
        name, package));
    GroupPackages.insert(
      std::pair<cmCPackComponentGroup*, cmCPackIFWPackage*>(
        group, package));
    BinaryPackages.insert(package);
    }
  else
    {
    Packages.erase(name);
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Cannot configure package \"" << name <<
                  "\" for component group \"" << group->Name << "\""
                  << std::endl);
    }
  return group;
}